

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O1

bool __thiscall protozero::pbf_reader::next(pbf_reader *this)

{
  char *pcVar1;
  char *pcVar2;
  pbf_wire_type pVar3;
  undefined8 *puVar4;
  pointer_____offset_0x10___ *ppuVar5;
  
  pcVar1 = this->m_data;
  pcVar2 = this->m_end;
  if (pcVar1 != pcVar2) {
    pVar3 = get_varint<unsigned_int>(this);
    this->m_tag = pVar3 >> 3;
    if ((pVar3 < 8) || (pVar3 - 0x251c0 < 8000)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__exception_00106cf8;
      ppuVar5 = &invalid_tag_exception::typeinfo;
    }
    else {
      pVar3 = pVar3 & 7;
      this->m_wire_type = pVar3;
      if ((pVar3 < (length_delimited|fixed64)) || (pVar3 == fixed32)) goto LAB_00103446;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__exception_00106d60;
      ppuVar5 = &unknown_pbf_wire_type_exception::typeinfo;
    }
    __cxa_throw(puVar4,ppuVar5,std::exception::~exception);
  }
LAB_00103446:
  return pcVar1 != pcVar2;
}

Assistant:

bool next() {
        if (m_data == m_end) {
            return false;
        }

        const auto value = get_varint<uint32_t>();
        m_tag = static_cast<pbf_tag_type>(value >> 3U);

        // tags 0 and 19000 to 19999 are not allowed as per
        // https://developers.google.com/protocol-buffers/docs/proto#assigning-tags
        if (m_tag == 0 || (m_tag >= 19000 && m_tag <= 19999)) {
            throw invalid_tag_exception{};
        }

        m_wire_type = pbf_wire_type(value & 0x07U);
        switch (m_wire_type) {
            case pbf_wire_type::varint:
            case pbf_wire_type::fixed64:
            case pbf_wire_type::length_delimited:
            case pbf_wire_type::fixed32:
                break;
            default:
                throw unknown_pbf_wire_type_exception{};
        }

        return true;
    }